

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O3

void Gia_ManDupMapped_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Gia_Man_t *pNew)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Gia_Obj_t *pGVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  
  pGVar6 = p->pObjs;
  if ((pObj < pGVar6) || (pGVar6 + p->nObjs <= pObj)) goto LAB_0060974e;
  iVar3 = (int)((long)pObj - (long)pGVar6 >> 2) * -0x55555555;
  if (p->nTravIdsAlloc <= iVar3) {
    __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x263,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
  }
  if (p->pTravIds[iVar3] == p->nTravIds) {
    return;
  }
  p->pTravIds[iVar3] = p->nTravIds;
  if (((int)(uint)*(undefined8 *)pObj < 0) ||
     (uVar4 = (uint)*(undefined8 *)pObj & 0x1fffffff, uVar4 == 0x1fffffff)) {
    __assert_fail("Gia_ObjIsAnd(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                  ,0x2ea,"void Gia_ManDupMapped_rec(Gia_Man_t *, Gia_Obj_t *, Gia_Man_t *)");
  }
  Gia_ManDupMapped_rec(p,pObj + -(ulong)uVar4,pNew);
  Gia_ManDupMapped_rec(p,pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff),pNew);
  uVar13 = *(ulong *)pObj;
  uVar4 = pObj[-(uVar13 & 0x1fffffff)].Value;
  if ((int)uVar4 < 0) {
LAB_0060978c:
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x132,"int Abc_LitNotCond(int, int)");
  }
  uVar5 = (uint)(uVar13 >> 0x20);
  uVar12 = pObj[-(ulong)(uVar5 & 0x1fffffff)].Value;
  if ((int)uVar12 < 0) goto LAB_0060978c;
  pGVar6 = Gia_ManAppendObj(pNew);
  uVar8 = uVar4 >> 1;
  uVar1 = pNew->nObjs;
  if ((int)uVar1 <= (int)uVar8) {
    __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x2a8,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
  }
  uVar7 = uVar12 >> 1;
  if (uVar1 <= uVar7) {
    __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x2a9,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
  }
  if ((uVar8 == uVar7) && (pNew->fGiaSimple == 0)) {
    __assert_fail("p->fGiaSimple || Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x2aa,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
  }
  uVar4 = (uint)(uVar13 >> 0x1d) & 1 ^ uVar4;
  uVar12 = uVar12 ^ uVar5 >> 0x1d & 1;
  pGVar2 = pNew->pObjs;
  iVar3 = (int)pGVar6;
  if (uVar4 < uVar12) {
    if (pGVar2 + uVar1 <= pGVar6 || pGVar6 < pGVar2) goto LAB_0060974e;
    uVar13 = *(ulong *)pGVar6;
    uVar9 = (ulong)((uVar4 & 1) << 0x1d |
                   ((uint)(iVar3 - (int)pGVar2) >> 2) * -0x55555555 - uVar8 & 0x1fffffff);
    *(ulong *)pGVar6 = uVar9 | uVar13 & 0xffffffffc0000000;
    pGVar2 = pNew->pObjs;
    if ((pGVar6 < pGVar2) || (pGVar2 + pNew->nObjs <= pGVar6)) goto LAB_0060974e;
    uVar13 = (ulong)(uVar12 & 1) << 0x3d |
             uVar9 | uVar13 & 0xc0000000c0000000 |
             (ulong)(((uint)(iVar3 - (int)pGVar2) >> 2) * -0x55555555 - uVar7 & 0x1fffffff) << 0x20;
  }
  else {
    if (pGVar2 + uVar1 <= pGVar6 || pGVar6 < pGVar2) goto LAB_0060974e;
    uVar13 = *(ulong *)pGVar6;
    uVar10 = (ulong)(((uint)(iVar3 - (int)pGVar2) >> 2) * -0x55555555 - uVar8 & 0x1fffffff) << 0x20;
    uVar9 = (ulong)(uVar4 & 1) << 0x3d;
    *(ulong *)pGVar6 = uVar9 | uVar13 & 0xc0000000ffffffff | uVar10;
    pGVar2 = pNew->pObjs;
    if ((pGVar6 < pGVar2) || (pGVar2 + pNew->nObjs <= pGVar6)) goto LAB_0060974e;
    uVar13 = (ulong)((uVar12 & 1) << 0x1d) | uVar9 | uVar13 & 0xc0000000c0000000 | uVar10 |
             (ulong)(((uint)(iVar3 - (int)pGVar2) >> 2) * -0x55555555 - uVar7 & 0x1fffffff);
  }
  *(ulong *)pGVar6 = uVar13;
  if (pNew->pFanData != (int *)0x0) {
    Gia_ObjAddFanout(pNew,pGVar6 + -(uVar13 & 0x1fffffff),pGVar6);
    Gia_ObjAddFanout(pNew,pGVar6 + -((ulong)*(uint *)&pGVar6->field_0x4 & 0x1fffffff),pGVar6);
  }
  if (pNew->fSweeper != 0) {
    uVar9 = *(ulong *)pGVar6 & 0x1fffffff;
    uVar13 = *(ulong *)pGVar6 >> 0x20 & 0x1fffffff;
    uVar10 = 0x4000000000000000;
    uVar11 = 0x4000000000000000;
    if (((uint)*(ulong *)(pGVar6 + -uVar9) >> 0x1e & 1) == 0) {
      uVar11 = 0x40000000;
    }
    *(ulong *)(pGVar6 + -uVar9) = uVar11 | *(ulong *)(pGVar6 + -uVar9);
    uVar11 = *(ulong *)(pGVar6 + -uVar13);
    if (((uint)uVar11 >> 0x1e & 1) == 0) {
      uVar10 = 0x40000000;
    }
    *(ulong *)(pGVar6 + -uVar13) = uVar10 | uVar11;
    uVar13 = *(ulong *)pGVar6;
    *(ulong *)pGVar6 =
         uVar13 & 0x7fffffffffffffff |
         (ulong)(((uint)(uVar13 >> 0x3d) ^ (uint)(uVar11 >> 0x3f)) &
                ((uint)((ulong)*(undefined8 *)(pGVar6 + -uVar9) >> 0x3f) ^
                (uint)(uVar13 >> 0x1d) & 7)) << 0x3f;
  }
  if (pNew->fBuiltInSim != 0) {
    uVar13 = *(ulong *)pGVar6;
    *(ulong *)pGVar6 =
         uVar13 & 0x7fffffffffffffff |
         (ulong)(((uint)(uVar13 >> 0x3d) ^
                 (uint)((ulong)*(undefined8 *)(pGVar6 + -(uVar13 >> 0x20 & 0x1fffffff)) >> 0x3f)) &
                ((uint)((ulong)*(undefined8 *)(pGVar6 + -(uVar13 & 0x1fffffff)) >> 0x3f) ^
                (uint)(uVar13 >> 0x1d) & 7)) << 0x3f;
    pGVar2 = pNew->pObjs;
    if ((pGVar6 < pGVar2) || (pGVar2 + pNew->nObjs <= pGVar6)) goto LAB_0060974e;
    Gia_ManBuiltInSimPerform(pNew,(int)((ulong)((long)pGVar6 - (long)pGVar2) >> 2) * -0x55555555);
  }
  if (pNew->vSuppWords != (Vec_Wrd_t *)0x0) {
    Gia_ManQuantSetSuppAnd(pNew,pGVar6);
  }
  pGVar2 = pNew->pObjs;
  if ((pGVar2 <= pGVar6) && (pGVar6 < pGVar2 + pNew->nObjs)) {
    pObj->Value = (int)((ulong)((long)pGVar6 - (long)pGVar2) >> 2) * 0x55555556;
    pGVar6 = p->pObjs;
    if ((pGVar6 <= pObj) && (pObj < pGVar6 + p->nObjs)) {
      Vec_IntPush(pNew->vLutConfigs,(int)((ulong)((long)pObj - (long)pGVar6) >> 2) * -0x55555555);
      return;
    }
  }
LAB_0060974e:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Gia_ManDupMapped_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Gia_Man_t * pNew )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return;
    Gia_ObjSetTravIdCurrent(p, pObj);
    assert( Gia_ObjIsAnd(pObj) );
    Gia_ManDupMapped_rec( p, Gia_ObjFanin0(pObj), pNew );
    Gia_ManDupMapped_rec( p, Gia_ObjFanin1(pObj), pNew );
    pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Vec_IntPush( pNew->vLutConfigs, Gia_ObjId(p, pObj) );
}